

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.cpp
# Opt level: O3

void __thiscall Timer::addTimerNode(Timer *this,TimerNode *newTimer)

{
  Node *ptr;
  TimerNode timer;
  iterator i;
  SmartPtr<Event> SStack_58;
  IEventDispatcher *local_50;
  TimerListener *pTStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  iterator local_30;
  
  ptr = ((this->mList).mHead)->next;
  if (ptr != (this->mList).mTail) {
    do {
      SmartPtr<Event>::SmartPtr(&SStack_58,(SmartPtr<Event> *)ptr);
      local_50 = (ptr->val).mDispatcher;
      pTStack_48 = (ptr->val).mListener;
      local_40._0_4_ = (ptr->val).mPrivateData;
      local_40._4_4_ = (ptr->val).mTick;
      uStack_38._0_4_ = (ptr->val).mRepeatMS;
      uStack_38._4_4_ = (ptr->val).mRemainingMS;
      if ((int)(newTimer->mTick - local_40._4_4_) < 0) {
        local_30.mNode = ptr->prev;
        JetHead::list<Timer::TimerNode>::iterator::insertAfter(&local_30,newTimer);
        SmartPtr<Event>::~SmartPtr(&SStack_58);
        return;
      }
      SmartPtr<Event>::~SmartPtr(&SStack_58);
      ptr = ptr->next;
    } while (ptr != (this->mList).mTail);
  }
  JetHead::list<Timer::TimerNode>::push_back(&this->mList,newTimer);
  return;
}

Assistant:

void Timer::addTimerNode( const TimerNode& newTimer )
{
	TRACE_BEGIN( LOG_LVL_NOISE );

	int32_t diff;
	bool inserted = false;

	// Add new timer node to the list (sorted)	
	for (JetHead::list<TimerNode>::iterator i = mList.begin();
		 i != mList.end(); ++i)
	{
		TimerNode timer = *i;
		diff = newTimer.mTick - timer.mTick;
		
		if ( diff < 0 )
		{
			i.insertBefore(newTimer);			
			inserted = true;
			break;
		}
	}
	
	if ( not inserted )
	{
		mList.push_back( newTimer );
	}
}